

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.cpp
# Opt level: O1

void __thiscall chrono::ChBodyAuxRef::SetFrame_COG_to_REF(ChBodyAuxRef *this,ChFrame<double> *mloc)

{
  ChBodyFrame *this_00;
  ChFrameMoving<double> *local;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  pointer psVar22;
  shared_ptr<chrono::ChMarker> *marker;
  pointer psVar23;
  ChFrameMoving<double> old_cog_to_abs;
  ChFrameMoving<double> cog_oldnew;
  ChFrameMoving<double> tmpref_to_abs;
  ChFrameMoving<double> local_4a0;
  double local_3a8;
  double dStack_3a0;
  double dStack_398;
  double dStack_390;
  double dStack_388;
  double dStack_380;
  double dStack_378;
  double dStack_370;
  double local_368;
  ChVector<double> local_358;
  ChQuaternion<double> local_340;
  undefined1 local_320 [24];
  double local_308;
  double local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double dStack_2d8;
  double dStack_2d0;
  double dStack_2c8;
  double dStack_2c0;
  double dStack_2b8;
  double dStack_2b0;
  double dStack_2a8;
  double local_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double local_280;
  double local_278;
  double dStack_270;
  double dStack_268;
  double dStack_260;
  undefined1 auStack_258 [24];
  double dStack_240;
  double dStack_238;
  double dStack_230;
  ChFrameMoving<double> local_228;
  ChFrameMoving<double> local_128;
  
  this_00 = &(this->super_ChBody).super_ChBodyFrame;
  local_4a0.super_ChFrame<double>.coord.pos.m_data[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
       coord.pos.m_data[0];
  local_4a0.super_ChFrame<double>.coord.pos.m_data[1] =
       *(double *)
        ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
               super_ChFrame<double>.coord.pos.m_data + 8);
  local_4a0.super_ChFrame<double>.coord.pos.m_data[2] =
       *(double *)
        ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
               super_ChFrame<double>.coord.pos.m_data + 0x10);
  local_4a0.super_ChFrame<double>.coord.rot.m_data[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
       coord.rot.m_data[0];
  local_4a0.super_ChFrame<double>.coord.rot.m_data[1] =
       *(double *)
        ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
               super_ChFrame<double>.coord.rot.m_data + 8);
  local_4a0.super_ChFrame<double>.coord.rot.m_data[2] =
       *(double *)
        ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
               super_ChFrame<double>.coord.rot.m_data + 0x10);
  local_4a0.super_ChFrame<double>.coord.rot.m_data[3] =
       *(double *)
        ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
               super_ChFrame<double>.coord.rot.m_data + 0x18);
  local_4a0.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
       Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_4a0.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 8);
  local_4a0.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x10);
  local_4a0.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x18);
  local_4a0.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x20);
  local_4a0.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x28);
  local_4a0.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x30);
  local_4a0.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x38);
  local_4a0.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x40);
  local_4a0.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b278;
  local_4a0.coord_dt.pos.m_data[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.pos.m_data[0];
  local_4a0.coord_dt.pos.m_data[1] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.pos.m_data[1];
  local_4a0.coord_dt.pos.m_data[2] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
  local_4a0.coord_dt.rot.m_data[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.m_data[0];
  local_4a0.coord_dt.rot.m_data[1] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.m_data[1];
  local_4a0.coord_dt.rot.m_data[2] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.m_data[2];
  local_4a0.coord_dt.rot.m_data[3] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.m_data[3];
  local_4a0.coord_dtdt.pos.m_data[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.pos.m_data[0];
  local_4a0.coord_dtdt.pos.m_data[1] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.pos.m_data[1];
  local_4a0.coord_dtdt.pos.m_data[2] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.pos.m_data[2];
  local_4a0.coord_dtdt.rot.m_data[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data[0];
  local_4a0.coord_dtdt.rot.m_data[1] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data[1];
  local_4a0.coord_dtdt.rot.m_data[2] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data[2];
  local_4a0.coord_dtdt.rot.m_data[3] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data[3];
  local_228.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_320._8_16_ = ZEXT816(0) << 0x20;
  local_320._0_8_ = (_func_int **)0x3ff0000000000000;
  local_308 = 0.0;
  local_228.super_ChFrame<double>._0_16_ = local_320._8_16_;
  ChFrameMoving<double>::ChFrameMoving
            (&local_128,(ChVector<double> *)&local_228,(ChQuaternion<double> *)local_320);
  local = &this->auxref_to_cog;
  ChFrameMoving<double>::TransformLocalToParent
            (&this_00->super_ChFrameMoving<double>,local,&local_128);
  local_320._8_16_ = *(undefined1 (*) [16])(mloc->coord).pos.m_data;
  local_308 = (mloc->coord).pos.m_data[2];
  local_300 = (mloc->coord).rot.m_data[0];
  local_2f8 = (mloc->coord).rot.m_data[1];
  local_2f0 = (mloc->coord).rot.m_data[2];
  local_2e8 = (mloc->coord).rot.m_data[3];
  local_2e0 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
  ;
  dStack_2d8 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
  dStack_2d0 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
  dStack_2c8 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
  dStack_2c0 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  dStack_2b8 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  dStack_2b0 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [6];
  dStack_2a8 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
  local_2a0 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
  ;
  local_320._0_8_ = &PTR__ChFrame_00b2b278;
  local_298 = 0.0;
  dStack_290 = 0.0;
  local_288 = 0.0;
  dStack_260 = 0.0;
  auStack_258 = (undefined1  [24])0x0;
  dStack_240 = 0.0;
  dStack_238 = 0.0;
  dStack_230 = 0.0;
  local_280 = 0.0;
  local_278 = 0.0;
  dStack_270 = 0.0;
  dStack_268 = 0.0;
  ChFrameMoving<double>::TransformLocalToParent
            (&local_128,(ChFrameMoving<double> *)local_320,&this_00->super_ChFrameMoving<double>);
  dVar1 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
          coord.pos.m_data[0];
  dVar2 = *(double *)
           ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                  super_ChFrame<double>.coord.pos.m_data + 8);
  dVar3 = *(double *)
           ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                  super_ChFrame<double>.coord.pos.m_data + 0x10);
  dVar4 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
          coord.rot.m_data[0];
  dVar5 = *(double *)
           ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                  super_ChFrame<double>.coord.rot.m_data + 8);
  dVar6 = *(double *)
           ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                  super_ChFrame<double>.coord.rot.m_data + 0x10);
  dVar7 = *(double *)
           ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                  super_ChFrame<double>.coord.rot.m_data + 0x18);
  local_368 = *(double *)
               ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                       super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x40);
  local_3a8 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
              super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
  ;
  dStack_3a0 = *(double *)
                ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 8);
  dStack_398 = *(double *)
                ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x10);
  dStack_390 = *(double *)
                ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x18);
  dStack_388 = *(double *)
                ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x20);
  dStack_380 = *(double *)
                ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x28);
  dStack_378 = *(double *)
                ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x30);
  dStack_370 = *(double *)
                ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x38);
  dVar8 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.pos.m_data[0];
  dVar9 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.pos.m_data[1];
  dVar10 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.pos.m_data[2]
  ;
  dVar11 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.m_data[0]
  ;
  dVar12 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.m_data[1]
  ;
  dVar13 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.m_data[2]
  ;
  dVar14 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.m_data[3]
  ;
  dVar15 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.pos.m_data
           [0];
  dVar16 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.pos.m_data
           [1];
  dVar17 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.pos.m_data
           [2];
  dVar18 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data
           [0];
  dVar19 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data
           [1];
  dVar20 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data
           [2];
  dVar21 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data
           [3];
  ChFrame<double>::GetInverse((ChFrame<double> *)local_320,mloc);
  ChFrameMoving<double>::operator=(local,(ChFrame<double> *)local_320);
  ChFrameMoving<double>::TransformLocalToParent
            (&this_00->super_ChFrameMoving<double>,local,&this->auxref_to_abs);
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = local_3a8
  ;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       dStack_3a0;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       dStack_398;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       dStack_390;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       dStack_388;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       dStack_380;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       dStack_378;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       dStack_370;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = local_368
  ;
  local_228.super_ChFrame<double>.coord.pos.m_data[0] = dVar1;
  local_228.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b278;
  local_228.super_ChFrame<double>.coord.pos.m_data[1] = dVar2;
  local_228.super_ChFrame<double>.coord.pos.m_data[2] = dVar3;
  local_228.super_ChFrame<double>.coord.rot.m_data[0] = dVar4;
  local_228.super_ChFrame<double>.coord.rot.m_data[1] = dVar5;
  local_228.super_ChFrame<double>.coord.rot.m_data[2] = dVar6;
  local_228.super_ChFrame<double>.coord.rot.m_data[3] = dVar7;
  local_228.coord_dt.pos.m_data[0] = dVar8;
  local_228.coord_dt.pos.m_data[1] = dVar9;
  local_228.coord_dt.pos.m_data[2] = dVar10;
  local_228.coord_dt.rot.m_data[0] = dVar11;
  local_228.coord_dt.rot.m_data[1] = dVar12;
  local_228.coord_dt.rot.m_data[2] = dVar13;
  local_228.coord_dt.rot.m_data[3] = dVar14;
  local_228.coord_dtdt.pos.m_data[0] = dVar15;
  local_228.coord_dtdt.pos.m_data[1] = dVar16;
  local_228.coord_dtdt.pos.m_data[2] = dVar17;
  local_228.coord_dtdt.rot.m_data[0] = dVar18;
  local_228.coord_dtdt.rot.m_data[1] = dVar19;
  local_228.coord_dtdt.rot.m_data[2] = dVar20;
  local_228.coord_dtdt.rot.m_data[3] = dVar21;
  ChFrameMoving<double>::Invert(&local_228);
  local_358.m_data[0] = 0.0;
  local_358.m_data[1] = 0.0;
  local_358.m_data[2] = 0.0;
  local_340.m_data[0] = 1.0;
  local_340.m_data[1] = 0.0;
  local_340.m_data[2] = 0.0;
  local_340.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving((ChFrameMoving<double> *)local_320,&local_358,&local_340);
  ChFrameMoving<double>::TransformLocalToParent
            (&local_228,&local_4a0,(ChFrameMoving<double> *)local_320);
  psVar23 = (this->super_ChBody).marklist.
            super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar22 = (this->super_ChBody).marklist.
            super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar23 != psVar22) {
    do {
      ChFrameMoving<double>::ConcatenatePreTransformation
                (&((psVar23->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_ChFrameMoving<double>,(ChFrameMoving<double> *)local_320);
      ChMarker::Update((psVar23->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,(this->super_ChBody).super_ChPhysicsItem.super_ChObj.ChTime);
      psVar23 = psVar23 + 1;
    } while (psVar23 != psVar22);
  }
  return;
}

Assistant:

void ChBodyAuxRef::SetFrame_COG_to_REF(const ChFrame<>& mloc) {
    ChFrameMoving<> old_cog_to_abs = *this;

    ChFrameMoving<> tmpref_to_abs;
    this->TransformLocalToParent(this->auxref_to_cog, tmpref_to_abs);
    tmpref_to_abs.TransformLocalToParent(ChFrameMoving<>(mloc), *this);
    // or, also, using overloaded operators for frames:
    //   tmpref_to_abs = auxref_to_cog >> *this;
    //   *this         = ChFrameMoving<>(mloc) >> tmpref_to_abs;

    ChFrameMoving<> new_cog_to_abs = *this;

    auxref_to_cog = mloc.GetInverse();
    this->TransformLocalToParent(this->auxref_to_cog, this->auxref_to_abs);
    // or, also, using overloaded operators for frames:
    //   *this->auxref_to_abs = this->auxref_to_cog.GetInverse() >> this;

    // Restore marker/forces positions, keeping unchanged respect to aux ref.
    ChFrameMoving<> cog_oldnew = old_cog_to_abs >> new_cog_to_abs.GetInverse();

    for (auto& marker : marklist) {
        marker->ConcatenatePreTransformation(cog_oldnew);
        marker->Update(ChTime);
    }

    // Forces: ?? to do...
    /*
    HIER_FORCE_INIT
    while (HIER_FORCE_NOSTOP)
    {
        FORCEpointer->
        FORCEpointer->Update (mytime);

        HIER_FORCE_NEXT
    }
    */
}